

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
duckdb_fmt::v6::internal::basic_writer<duckdb_fmt::v6::buffer_range<char>_>::write_decimal<__int128>
          (basic_writer<duckdb_fmt::v6::buffer_range<char>_> *this,__int128 value)

{
  undefined1 value_00 [16];
  undefined1 n [16];
  undefined1 value_01 [16];
  bool bVar1;
  checked_ptr<typename_buffer<char>::value_type> pcVar2;
  long in_RDX;
  checked_ptr<typename_buffer<char>::value_type> pcVar3;
  internal *in_RSI;
  basic_writer<duckdb_fmt::v6::buffer_range<char>_> *in_RDI;
  checked_ptr<typename_buffer<char>::value_type> *it;
  int num_digits;
  bool negative;
  uint32_or_64_or_128_t<__int128> abs_value;
  size_t in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  internal *out;
  internal *local_48;
  long local_40;
  
  value_00._8_8_ = in_RDI;
  value_00._0_8_ = in_stack_ffffffffffffff48;
  bVar1 = is_negative<__int128,_0>(in_RSI,(__int128)value_00);
  local_48 = in_RSI;
  local_40 = in_RDX;
  if (bVar1) {
    local_48 = (internal *)-(long)in_RSI;
    local_40 = -(ulong)(in_RSI != (internal *)0x0) - in_RDX;
  }
  n._8_4_ = in_stack_ffffffffffffff58;
  n._0_8_ = in_RDI;
  n._12_4_ = in_stack_ffffffffffffff5c;
  out = local_48;
  count_digits((uint128_t)n);
  pcVar2 = reserve(in_RDI,in_stack_ffffffffffffff48);
  pcVar3 = pcVar2;
  if (bVar1) {
    pcVar3 = pcVar2 + 1;
    *pcVar2 = '-';
  }
  value_01._8_8_ = pcVar3;
  value_01._0_8_ = local_40;
  format_decimal<char,char*,unsigned__int128>
            ((char *)out,(unsigned___int128)value_01,(int)((ulong)local_48 >> 0x20));
  return;
}

Assistant:

void write_decimal(Int value) {
    auto abs_value = static_cast<uint32_or_64_or_128_t<Int>>(value);
    bool negative = is_negative(value);
    // Don't do -abs_value since it trips unsigned-integer-overflow sanitizer.
    if (negative) abs_value = ~abs_value + 1;
    int num_digits = count_digits(abs_value);
    auto&& it = reserve((negative ? 1 : 0) + static_cast<size_t>(num_digits));
    if (negative) *it++ = static_cast<char_type>('-');
    it = format_decimal<char_type>(it, abs_value, num_digits);
  }